

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O0

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>_>
         *this)

{
  long *plVar1;
  long in_RDI;
  CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  obj;
  code *local_98;
  long local_68 [13];
  
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  ::CATCH2_INTERNAL_TEMPLATE_TEST_135
            ((CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
              *)0x90e5e6);
  local_98 = *(code **)(in_RDI + 8);
  plVar1 = (long *)((long)local_68 + *(long *)(in_RDI + 0x10));
  if (((ulong)local_98 & 1) != 0) {
    local_98 = *(code **)(local_98 + *plVar1 + -1);
  }
  (*local_98)(plVar1);
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  ::~CATCH2_INTERNAL_TEMPLATE_TEST_135
            ((CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
              *)0x90e64a);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }